

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaAnalytic_mels.c
# Opt level: O3

int check_ans(N_Vector y,sunrealtype t,sunrealtype rtol,sunrealtype atol)

{
  N_Vector y_00;
  undefined8 uVar1;
  N_Vector yp;
  uint uVar2;
  double dVar3;
  
  y_00 = (N_Vector)N_VClone();
  uVar1 = N_VClone(y);
  yp = (N_Vector)N_VClone(y);
  analytical_solution(t,y_00,yp);
  N_VConst(0x3e112e0be826d695,yp);
  N_VAbs(y_00,uVar1);
  N_VLinearSum(0x3f1a36e2eb1c432d,uVar1,yp,uVar1);
  dVar3 = (double)N_VMin(uVar1);
  if (dVar3 <= 0.0) {
    check_ans_cold_1();
    uVar2 = 0xffffffff;
  }
  else {
    N_VInv(uVar1,uVar1);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,y,y_00,y_00);
    dVar3 = (double)N_VWrmsNorm(y_00,uVar1);
    if (1.0 <= dVar3) {
      fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
    }
    uVar2 = (uint)(1.0 <= dVar3);
    N_VDestroy(y_00);
    N_VDestroy(yp);
    N_VDestroy(uVar1);
  }
  return uVar2;
}

Assistant:

static int check_ans(N_Vector y, sunrealtype t, sunrealtype rtol, sunrealtype atol)
{
  int passfail = 0; /* answer pass (0) or fail (1) retval */
  N_Vector ytrue;   /* true solution vector               */
  N_Vector ewt;     /* error weight vector                */
  N_Vector abstol;  /* absolute tolerance vector          */
  sunrealtype err;  /* wrms error                         */
  sunrealtype ONE = SUN_RCONST(1.0);

  /* create solution and error weight vectors */
  ytrue  = N_VClone(y);
  ewt    = N_VClone(y);
  abstol = N_VClone(y);

  /* set the solution data */
  analytical_solution(t, ytrue, abstol);

  /* compute the error weight vector, loosen atol */
  N_VConst(atol, abstol);
  N_VAbs(ytrue, ewt);
  N_VLinearSum(rtol, ewt, SUN_RCONST(10.0), abstol, ewt);
  if (N_VMin(ewt) <= SUN_RCONST(0.0))
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n");
    return (-1);
  }
  N_VInv(ewt, ewt);

  /* compute the solution error */
  N_VLinearSum(ONE, y, -ONE, ytrue, ytrue);
  err = N_VWrmsNorm(ytrue, ewt);

  /* is the solution within the tolerances? */
  passfail = (err < ONE) ? 0 : 1;

  if (passfail)
  {
    fprintf(stdout, "\nSUNDIALS_WARNING: check_ans error=%" GSYM "\n\n", err);
  }

  /* Free vectors */
  N_VDestroy(ytrue);
  N_VDestroy(abstol);
  N_VDestroy(ewt);

  return (passfail);
}